

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mjs::interpreter::impl::scope::scope(scope *this,object_ptr *act,scope_ptr *prev)

{
  gc_heap *pgVar1;
  uint32_t local_20;
  
  pgVar1 = (act->super_gc_heap_ptr_untyped).heap_;
  this->heap_ = pgVar1;
  (this->activation_).pos_ = (act->super_gc_heap_ptr_untyped).pos_;
  (this->prev_).pos_ = (prev->super_gc_heap_ptr_untyped).pos_;
  gc_vector<const_mjs::function_definition_*>::make
            ((gc_heap *)&stack0xffffffffffffffd8,(uint32_t)pgVar1);
  (this->active_functions_).pos_ = local_20;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd8);
  gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>::make
            ((gc_heap *)&stack0xffffffffffffffd8,(uint32_t)this->heap_);
  (this->active_function_values_).pos_ = local_20;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

explicit scope(const object_ptr& act, const scope_ptr& prev)
            : heap_(act.heap())
            , activation_(act)
            , prev_(prev)
            , active_functions_(gc_vector<const function_definition*>::make(heap_, 4))
            , active_function_values_(gc_vector<weak_object_ptr>::make(heap_, 4)) {
        }